

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDASetJacTimes(void *ida_mem,IDALsJacTimesSetupFn jtsetup,IDALsJacTimesVecFn jtimes)

{
  long in_RDX;
  undefined8 in_RSI;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  IDAMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                             (IDAMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                             ,(IDALsMem *)0x11be3e);
  if (local_4 == 0) {
    if (*(long *)(*(long *)(*(long *)(in_stack_ffffffffffffffd0 + 0x20) + 8) + 0x10) == 0) {
      IDAProcessError(in_stack_ffffffffffffffd8,-3,0x1e5,"IDASetJacTimes",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                      ,"SUNLinearSolver object does not support user-supplied ATimes routine");
      local_4 = -3;
    }
    else {
      if (in_RDX == 0) {
        in_stack_ffffffffffffffd0[0x120] = '\x01';
        in_stack_ffffffffffffffd0[0x121] = '\0';
        in_stack_ffffffffffffffd0[0x122] = '\0';
        in_stack_ffffffffffffffd0[0x123] = '\0';
        in_stack_ffffffffffffffd0[0x128] = '\0';
        in_stack_ffffffffffffffd0[0x129] = '\0';
        in_stack_ffffffffffffffd0[0x12a] = '\0';
        in_stack_ffffffffffffffd0[299] = '\0';
        in_stack_ffffffffffffffd0[300] = '\0';
        in_stack_ffffffffffffffd0[0x12d] = '\0';
        in_stack_ffffffffffffffd0[0x12e] = '\0';
        in_stack_ffffffffffffffd0[0x12f] = '\0';
        *(code **)(in_stack_ffffffffffffffd0 + 0x130) = idaLsDQJtimes;
        *(IDAResFn *)(in_stack_ffffffffffffffd0 + 0x138) = in_stack_ffffffffffffffd8->ida_res;
        *(IDAMem *)(in_stack_ffffffffffffffd0 + 0x140) = in_stack_ffffffffffffffd8;
      }
      else {
        in_stack_ffffffffffffffd0[0x120] = '\0';
        in_stack_ffffffffffffffd0[0x121] = '\0';
        in_stack_ffffffffffffffd0[0x122] = '\0';
        in_stack_ffffffffffffffd0[0x123] = '\0';
        *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x128) = in_RSI;
        *(long *)(in_stack_ffffffffffffffd0 + 0x130) = in_RDX;
        *(void **)(in_stack_ffffffffffffffd0 + 0x140) = in_stack_ffffffffffffffd8->ida_user_data;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int IDASetJacTimes(void* ida_mem, IDALsJacTimesSetupFn jtsetup,
                   IDALsJacTimesVecFn jtimes)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (idals_mem->LS->ops->setatimes == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (IDALS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in IDALs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL)
  {
    idals_mem->jtimesDQ = SUNFALSE;
    idals_mem->jtsetup  = jtsetup;
    idals_mem->jtimes   = jtimes;
    idals_mem->jt_data  = IDA_mem->ida_user_data;
  }
  else
  {
    idals_mem->jtimesDQ = SUNTRUE;
    idals_mem->jtsetup  = NULL;
    idals_mem->jtimes   = idaLsDQJtimes;
    idals_mem->jt_res   = IDA_mem->ida_res;
    idals_mem->jt_data  = IDA_mem;
  }

  return (IDALS_SUCCESS);
}